

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::numbers_internal::safe_strto64_base
          (numbers_internal *this,string_view text,Nonnull<int64_t_*> value,int base)

{
  numbers_internal *pnVar1;
  numbers_internal nVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  numbers_internal *in_RAX;
  uint uVar8;
  long *plVar9;
  numbers_internal *pnVar10;
  long lVar11;
  int iVar12;
  numbers_internal *pnVar13;
  numbers_internal *pnVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  
  uVar8 = (uint)value;
  plVar9 = (long *)text._M_str;
  pnVar13 = (numbers_internal *)text._M_len;
  *plVar9 = 0;
  if (pnVar13 == (numbers_internal *)0x0) {
LAB_0032ea9c:
    bVar7 = false;
  }
  else {
    pnVar10 = pnVar13;
    if (0 < (long)this) {
      do {
        if (((&ascii_internal::kPropertyBits)[(byte)*pnVar10] & 8) == 0) break;
        pnVar10 = pnVar10 + 1;
      } while (pnVar10 < pnVar13 + (long)this);
    }
    pnVar14 = pnVar13 + 1;
    in_RAX = pnVar13;
    do {
      if (in_RAX + (long)this <= pnVar10) goto LAB_0032ea9c;
      pnVar1 = in_RAX + -1;
      pnVar14 = pnVar14 + -1;
      in_RAX = in_RAX + -1;
    } while (((&ascii_internal::kPropertyBits)[(byte)pnVar1[(long)this]] & 8) != 0);
    nVar2 = *pnVar10;
    pnVar1 = in_RAX + (long)this;
    in_RAX = (numbers_internal *)(ulong)(nVar2 == (numbers_internal)0x2d);
    if (((nVar2 == (numbers_internal)0x2d) || (nVar2 == (numbers_internal)0x2b)) &&
       (pnVar10 = pnVar10 + 1, pnVar1 + 1 <= pnVar10)) {
LAB_0032ec3c:
      bVar7 = false;
    }
    else {
      if (uVar8 == 0x10) {
        uVar17 = 0x10;
        if (((1 < (long)(pnVar14 + ((long)this - (long)pnVar10))) &&
            (*pnVar10 == (numbers_internal)0x30)) && (((byte)pnVar10[1] | 0x20) == 0x78)) {
LAB_0032ec26:
          pnVar10 = pnVar10 + 2;
          uVar17 = 0x10;
          if (pnVar1 + 1 <= pnVar10) goto LAB_0032ec3c;
        }
      }
      else if (uVar8 == 0) {
        if (((1 < (long)(pnVar14 + ((long)this - (long)pnVar10))) &&
            (*pnVar10 == (numbers_internal)0x30)) && (((byte)pnVar10[1] | 0x20) == 0x78))
        goto LAB_0032ec26;
        if ((long)(pnVar14 + ((long)this - (long)pnVar10)) < 1) {
          uVar17 = 10;
        }
        else {
          nVar2 = *pnVar10;
          pnVar10 = pnVar10 + (nVar2 == (numbers_internal)0x30);
          uVar17 = (uint)(nVar2 != (numbers_internal)0x30) * 2 + 8;
        }
      }
      else {
        uVar17 = uVar8;
        if (0x22 < uVar8 - 2) goto LAB_0032ec3c;
      }
      uVar8 = uVar17;
      this = pnVar14 + ((long)this - (long)pnVar10);
      bVar7 = true;
      pnVar13 = pnVar10;
    }
  }
  if (!bVar7) {
    return false;
  }
  if (((ulong)in_RAX & 1) == 0) {
    if ((int)uVar8 < 0) {
      __assert_fail("base >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/numbers.cc"
                    ,0x3db,
                    "bool absl::lts_20250127::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = long]"
                   );
    }
    uVar16 = CONCAT44(0,uVar8);
    lVar3 = *(long *)(lts_20250127::(anonymous_namespace)::LookupTables<long>::kVmaxOverBase +
                     uVar16 * 8);
    if ((1 < (int)uVar8) &&
       (auVar4._8_8_ = 0, auVar4._0_8_ = uVar16,
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar4,0) != lVar3)) {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/numbers.cc"
                    ,0x3e0,
                    "bool absl::lts_20250127::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = long]"
                   );
    }
    bVar7 = (long)this < 1;
    if (0 < (long)this) {
      pnVar10 = this + (long)pnVar13;
      lVar11 = 0;
      do {
        lVar15 = (long)(char)lts_20250127::(anonymous_namespace)::kAsciiToInt[(byte)*pnVar13];
        if (lVar15 < (long)uVar16) {
          if ((lVar3 < lVar11) ||
             (lVar11 = lVar11 * uVar16,
             lVar11 - (0x7fffffffffffffff - lVar15) != 0 && 0x7fffffffffffffff - lVar15 <= lVar11))
          {
            *plVar9 = 0x7fffffffffffffff;
            goto LAB_0032ebd0;
          }
          lVar11 = lVar11 + lVar15;
          bVar6 = true;
        }
        else {
          *plVar9 = lVar11;
LAB_0032ebd0:
          bVar6 = false;
        }
        if (!bVar6) {
          return bVar7;
        }
        pnVar13 = pnVar13 + 1;
        bVar7 = pnVar13 >= pnVar10;
      } while (pnVar13 < pnVar10);
      goto LAB_0032ebec;
    }
  }
  else {
    lVar15 = (long)(int)uVar8;
    lVar3 = *(long *)(lts_20250127::(anonymous_namespace)::LookupTables<long>::kVminOverBase +
                     lVar15 * 8);
    if ((1 < (int)uVar8) &&
       (auVar5._8_8_ = 0, auVar5._0_8_ = SUB168(SEXT816(-0x8000000000000000),8),
       SUB168((auVar5 << 0x40 | ZEXT816(0x8000000000000000)) / SEXT816(lVar15),0) != lVar3)) {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::min() / base == vmin_over_base",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/numbers.cc"
                    ,0x403,
                    "bool absl::lts_20250127::(anonymous namespace)::safe_parse_negative_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = long]"
                   );
    }
    bVar7 = (long)this < 1;
    if (0 < (long)this) {
      pnVar10 = this + (long)pnVar13;
      lVar11 = 0;
      do {
        iVar12 = (int)(char)lts_20250127::(anonymous_namespace)::kAsciiToInt[(byte)*pnVar13];
        if (iVar12 < (int)uVar8) {
          if (lVar11 < lVar3) {
LAB_0032eb24:
            *plVar9 = -0x8000000000000000;
            goto LAB_0032eb2c;
          }
          lVar11 = lVar11 * lVar15;
          if (lVar11 < (long)((long)iVar12 | 0x8000000000000000U)) goto LAB_0032eb24;
          lVar11 = lVar11 - iVar12;
          bVar6 = true;
        }
        else {
          *plVar9 = lVar11;
LAB_0032eb2c:
          bVar6 = false;
        }
        if (!bVar6) {
          return bVar7;
        }
        pnVar13 = pnVar13 + 1;
        bVar7 = pnVar13 >= pnVar10;
      } while (pnVar13 < pnVar10);
      goto LAB_0032ebec;
    }
  }
  bVar7 = (long)this < 1;
  lVar11 = 0;
LAB_0032ebec:
  *plVar9 = lVar11;
  return bVar7;
}

Assistant:

bool safe_strto64_base(absl::string_view text, absl::Nonnull<int64_t*> value,
                       int base) {
  return safe_int_internal<int64_t>(text, value, base);
}